

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O0

void __thiscall
xLearn::MODEL_TEST_SerializeToTXT_Test::TestBody(MODEL_TEST_SerializeToTXT_Test *this)

{
  Model model_ffm;
  Model model_fm;
  Model model_lr;
  HyperParam hyper_param;
  HyperParam *in_stack_fffffffffffffb90;
  allocator local_449;
  string local_448 [183];
  allocator local_391;
  string local_390 [183];
  allocator local_2d9;
  string local_2d8 [200];
  string local_210 [312];
  string *in_stack_ffffffffffffff28;
  Model *in_stack_ffffffffffffff30;
  
  Init();
  std::__cxx11::string::operator=(local_210,"linear");
  Model::Model((Model *)in_stack_fffffffffffffb90);
  Model::Initialize((Model *)model_fm.param_b_,(string *)model_fm.param_v_,
                    (string *)model_fm.param_w_,model_fm.aux_size_,model_fm.num_K_,
                    model_fm.num_field_,(index_t)model_fm.param_best_v_,(real_t)model_fm.num_feat_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"test_txt.linear",&local_2d9);
  Model::SerializeToTXT(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::operator=(local_210,"fm");
  Model::Model((Model *)in_stack_fffffffffffffb90);
  Model::Initialize((Model *)model_fm.param_b_,(string *)model_fm.param_v_,
                    (string *)model_fm.param_w_,model_fm.aux_size_,model_fm.num_K_,
                    model_fm.num_field_,(index_t)model_fm.param_best_v_,(real_t)model_fm.num_feat_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"test_txt.fm",&local_391);
  Model::SerializeToTXT(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::operator=(local_210,"ffm");
  Model::Model((Model *)in_stack_fffffffffffffb90);
  Model::Initialize((Model *)model_fm.param_b_,(string *)model_fm.param_v_,
                    (string *)model_fm.param_w_,model_fm.aux_size_,model_fm.num_K_,
                    model_fm.num_field_,(index_t)model_fm.param_best_v_,(real_t)model_fm.num_feat_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"test_txt.ffm",&local_449);
  Model::SerializeToTXT(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  Model::~Model((Model *)in_stack_fffffffffffffb90);
  Model::~Model((Model *)in_stack_fffffffffffffb90);
  Model::~Model((Model *)in_stack_fffffffffffffb90);
  HyperParam::~HyperParam(in_stack_fffffffffffffb90);
  return;
}

Assistant:

TEST(MODEL_TEST, SerializeToTXT) {
  HyperParam hyper_param = Init();
  // linear
  hyper_param.score_func = "linear";
  Model model_lr;
  model_lr.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_lr.SerializeToTXT("test_txt.linear");
  // fm
  hyper_param.score_func = "fm";
  Model model_fm;
  model_fm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_fm.SerializeToTXT("test_txt.fm");
  // ffm
  hyper_param.score_func = "ffm";
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_ffm.SerializeToTXT("test_txt.ffm");
}